

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O3

string * __thiscall
wabt::Decompiler::Decompile_abi_cxx11_(string *__return_storage_ptr__,Decompiler *this)

{
  ulong *puVar1;
  Enum EVar2;
  int iVar3;
  Memory *args;
  pointer ppGVar4;
  Global *args_00;
  Table *args_01;
  int *piVar5;
  Func *f;
  size_type sVar6;
  LoadStoreTracking *this_00;
  char cVar7;
  bool bVar8;
  Module *pMVar9;
  long *plVar10;
  pointer pTVar11;
  uint uVar12;
  char *args_1;
  ulong uVar13;
  string *args_1_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  Index IVar16;
  char cVar17;
  char (*args_2) [2];
  char (*in_R9) [4];
  char cVar18;
  string *psVar19;
  Type t;
  long lVar20;
  ulong uVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *stat;
  pointer ppMVar22;
  pointer ppGVar23;
  pointer ppTVar24;
  _Alloc_hider _Var25;
  Index IVar26;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string __str;
  string __str_1;
  string ds;
  Decompiler *pDVar27;
  string local_190;
  Index local_170;
  char local_169;
  string *local_168;
  string local_160;
  string local_140;
  LoadStoreTracking *local_120;
  undefined1 local_118 [200];
  _Base_ptr local_50;
  Func **local_48;
  pointer local_40;
  pointer local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pMVar9 = (this->mc).module;
  ppMVar22 = (pMVar9->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  psVar19 = (string *)
            (pMVar9->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((string *)ppMVar22 != psVar19) {
    pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_168 = psVar19;
    do {
      args = *ppMVar22;
      in_R9 = (char (*) [4])(args->name)._M_dataplus._M_p;
      IVar16 = (Index)pbVar14;
      name._M_str = (char *)in_R9;
      name._M_len = (args->name)._M_string_length;
      bVar8 = CheckImportExport(this,__return_storage_ptr__,Memory,IVar16,name);
      cat<char[8],std::__cxx11::string>
                ((string *)local_118,(wabt *)"memory ",(char (*) [8])args,pbVar14);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_118._0_8_);
      if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
      }
      if (!bVar8) {
        uVar21 = (args->page_limits).initial;
        cVar18 = '\x01';
        cVar17 = '\x01';
        if (9 < uVar21) {
          uVar13 = uVar21;
          cVar7 = '\x04';
          do {
            cVar17 = cVar7;
            if (uVar13 < 100) {
              cVar17 = cVar17 + -2;
              goto LAB_00157071;
            }
            if (uVar13 < 1000) {
              cVar17 = cVar17 + -1;
              goto LAB_00157071;
            }
            if (uVar13 < 10000) goto LAB_00157071;
            bVar8 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar7 = cVar17 + '\x04';
          } while (bVar8);
          cVar17 = cVar17 + '\x01';
        }
LAB_00157071:
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_190,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_190._M_dataplus._M_p,(uint)local_190._M_string_length,uVar21);
        uVar21 = (args->page_limits).max;
        if (9 < uVar21) {
          uVar13 = uVar21;
          cVar17 = '\x04';
          do {
            cVar18 = cVar17;
            if (uVar13 < 100) {
              cVar18 = cVar18 + -2;
              goto LAB_001570f8;
            }
            if (uVar13 < 1000) {
              cVar18 = cVar18 + -1;
              goto LAB_001570f8;
            }
            if (uVar13 < 10000) goto LAB_001570f8;
            bVar8 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar17 = cVar18 + '\x04';
          } while (bVar8);
          cVar18 = cVar18 + '\x01';
        }
LAB_001570f8:
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_140,cVar18);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_140._M_dataplus._M_p,(uint)local_140._M_string_length,uVar21);
        in_R9 = (char (*) [4])0x1e44b7;
        cat<char[11],std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                  ((string *)local_118,(wabt *)"(initial: ",(char (*) [11])&local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", max: ",
                   (char (*) [8])&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e44b7,
                   (char (*) [2])this);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_118._0_8_);
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
        }
        psVar19 = local_168;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (ulong)(IVar16 + 1);
      ppMVar22 = ppMVar22 + 1;
    } while ((string *)ppMVar22 != psVar19);
    pMVar9 = (this->mc).module;
    if ((pMVar9->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pMVar9->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pMVar9 = (this->mc).module;
    }
  }
  ppGVar23 = (pMVar9->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppGVar4 = (pMVar9->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppGVar23 != ppGVar4) {
    IVar16 = 0;
    do {
      args_00 = *ppGVar23;
      in_R9 = (char (*) [4])(args_00->name)._M_dataplus._M_p;
      name_00._M_str = (char *)in_R9;
      name_00._M_len = (args_00->name)._M_string_length;
      bVar8 = CheckImportExport(this,__return_storage_ptr__,Global,IVar16,name_00);
      EVar2 = (args_00->type).enum_;
      local_190._M_dataplus._M_p = "byte";
      switch(EVar2) {
      case I8U:
        local_190._M_dataplus._M_p = "ubyte";
        break;
      case I16U:
        local_190._M_dataplus._M_p = "ushort";
        break;
      case I32U:
        local_190._M_dataplus._M_p = "uint";
        break;
      case ExternRef:
        local_190._M_dataplus._M_p = "externref";
        break;
      case FuncRef:
        local_190._M_dataplus._M_p = "funcref";
        break;
      case 0xfffffff1:
      case 0xfffffff2:
      case 0xfffffff3:
      case FuncRef|I8U:
      case 0xfffffff5:
      case FuncRef|I16U:
      case FuncRef|I32U:
      case ~I32U:
      case Any:
      case ~I64:
      case ~F32:
      case ~F64:
      case ~I8:
switchD_00157271_caseD_fffffff1:
        local_190._M_dataplus._M_p = "ILLEGAL";
        break;
      case I16:
        local_190._M_dataplus._M_p = "short";
        break;
      case I8:
        break;
      case V128:
        local_190._M_dataplus._M_p = "simd";
        break;
      case F64:
        local_190._M_dataplus._M_p = "double";
        break;
      case F32:
        local_190._M_dataplus._M_p = "float";
        break;
      case I64:
        local_190._M_dataplus._M_p = "long";
        break;
      case I32:
        local_190._M_dataplus._M_p = "int";
        break;
      default:
        if (EVar2 == Void) {
          local_190._M_dataplus._M_p = "void";
        }
        else {
          if (EVar2 != Func) goto switchD_00157271_caseD_fffffff1;
          local_190._M_dataplus._M_p = "func";
        }
      }
      args_1 = ":";
      cat<char[8],std::__cxx11::string,char[2],char_const*>
                ((string *)local_118,(wabt *)"global ",(char (*) [8])args_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)":",
                 (char (*) [2])&local_190,(char **)in_R9);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_118._0_8_);
      if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
      }
      if (!bVar8) {
        InitExp_abi_cxx11_(&local_190,this,&args_00->init_expr);
        cat<char[4],std::__cxx11::string>
                  ((string *)local_118,(wabt *)0x1ed24c,(char (*) [4])&local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_118._0_8_);
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      IVar16 = IVar16 + 1;
      ppGVar23 = ppGVar23 + 1;
    } while (ppGVar23 != ppGVar4);
    pMVar9 = (this->mc).module;
    if ((pMVar9->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pMVar9->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pMVar9 = (this->mc).module;
    }
  }
  ppTVar24 = (pMVar9->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  psVar19 = (string *)
            (pMVar9->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((string *)ppTVar24 != psVar19) {
    IVar16 = 0;
    local_168 = psVar19;
    do {
      args_01 = *ppTVar24;
      in_R9 = (char (*) [4])(args_01->name)._M_dataplus._M_p;
      name_01._M_str = (char *)in_R9;
      name_01._M_len = (args_01->name)._M_string_length;
      bVar8 = CheckImportExport(this,__return_storage_ptr__,Table,IVar16,name_01);
      EVar2 = (args_01->elem_type).enum_;
      local_190._M_dataplus._M_p = "byte";
      switch(EVar2) {
      case I8U:
        local_190._M_dataplus._M_p = "ubyte";
        break;
      case I16U:
        local_190._M_dataplus._M_p = "ushort";
        break;
      case I32U:
        local_190._M_dataplus._M_p = "uint";
        break;
      case ExternRef:
        local_190._M_dataplus._M_p = "externref";
        break;
      case FuncRef:
        local_190._M_dataplus._M_p = "funcref";
        break;
      case 0xfffffff1:
      case 0xfffffff2:
      case 0xfffffff3:
      case FuncRef|I8U:
      case 0xfffffff5:
      case FuncRef|I16U:
      case FuncRef|I32U:
      case ~I32U:
      case Any:
      case ~I64:
      case ~F32:
      case ~F64:
      case ~I8:
switchD_0015749c_caseD_fffffff1:
        local_190._M_dataplus._M_p = "ILLEGAL";
        break;
      case I16:
        local_190._M_dataplus._M_p = "short";
        break;
      case I8:
        break;
      case V128:
        local_190._M_dataplus._M_p = "simd";
        break;
      case F64:
        local_190._M_dataplus._M_p = "double";
        break;
      case F32:
        local_190._M_dataplus._M_p = "float";
        break;
      case I64:
        local_190._M_dataplus._M_p = "long";
        break;
      case I32:
        local_190._M_dataplus._M_p = "int";
        break;
      default:
        if (EVar2 == Void) {
          local_190._M_dataplus._M_p = "void";
        }
        else {
          if (EVar2 != Func) goto switchD_0015749c_caseD_fffffff1;
          local_190._M_dataplus._M_p = "func";
        }
      }
      cat<char[7],std::__cxx11::string,char[2],char_const*>
                ((string *)local_118,(wabt *)"table ",(char (*) [7])args_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)":",
                 (char (*) [2])&local_190,(char **)in_R9);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_118._0_8_);
      if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
      }
      if (!bVar8) {
        uVar21 = (args_01->elem_limits).initial;
        cVar18 = '\x01';
        cVar17 = '\x01';
        if (9 < uVar21) {
          uVar13 = uVar21;
          cVar7 = '\x04';
          do {
            cVar17 = cVar7;
            if (uVar13 < 100) {
              cVar17 = cVar17 + -2;
              goto LAB_001575f7;
            }
            if (uVar13 < 1000) {
              cVar17 = cVar17 + -1;
              goto LAB_001575f7;
            }
            if (uVar13 < 10000) goto LAB_001575f7;
            bVar8 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar7 = cVar17 + '\x04';
          } while (bVar8);
          cVar17 = cVar17 + '\x01';
        }
LAB_001575f7:
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_190,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_190._M_dataplus._M_p,(uint)local_190._M_string_length,uVar21);
        uVar21 = (args_01->elem_limits).max;
        if (9 < uVar21) {
          uVar13 = uVar21;
          cVar17 = '\x04';
          do {
            cVar18 = cVar17;
            if (uVar13 < 100) {
              cVar18 = cVar18 + -2;
              goto LAB_0015767f;
            }
            if (uVar13 < 1000) {
              cVar18 = cVar18 + -1;
              goto LAB_0015767f;
            }
            if (uVar13 < 10000) goto LAB_0015767f;
            bVar8 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar17 = cVar18 + '\x04';
          } while (bVar8);
          cVar18 = cVar18 + '\x01';
        }
LAB_0015767f:
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_140,cVar18);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_140._M_dataplus._M_p,(uint)local_140._M_string_length,uVar21);
        in_R9 = (char (*) [4])0x1e44b7;
        cat<char[7],std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                  ((string *)local_118,(wabt *)"(min: ",(char (*) [7])&local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", max: ",
                   (char (*) [8])&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e44b7,
                   (char (*) [2])this);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_118._0_8_);
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
        }
        psVar19 = local_168;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      IVar16 = IVar16 + 1;
      ppTVar24 = ppTVar24 + 1;
    } while ((string *)ppTVar24 != psVar19);
    pMVar9 = (this->mc).module;
    if ((pMVar9->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pMVar9->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pMVar9 = (this->mc).module;
    }
  }
  psVar19 = (string *)
            (pMVar9->data_segments).
            super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  args_1_00 = (string *)
              (pMVar9->data_segments).
              super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (psVar19 != args_1_00) {
    local_168 = args_1_00;
    do {
      piVar5 = (int *)(psVar19->_M_dataplus)._M_p;
      iVar3 = *piVar5;
      if (iVar3 == 1) {
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"(passive","");
      }
      else {
        InitExp_abi_cxx11_(&local_140,this,(ExprList *)(piVar5 + 0x1c));
        cat<char[10],std::__cxx11::string>
                  (&local_190,(wabt *)"(offset: ",(char (*) [10])&local_140,args_1_00);
      }
      args_1_00 = &local_190;
      cat<char[6],std::__cxx11::string,std::__cxx11::string,char[4]>
                ((string *)local_118,(wabt *)"data ",(char (*) [6])(piVar5 + 2),&local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") =",in_R9);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_118._0_8_);
      if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if ((iVar3 != 1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2)) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      BinaryToString_abi_cxx11_
                ((string *)local_118,this,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(piVar5 + 0x22));
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_118._0_8_);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
      }
      psVar19 = (string *)&psVar19->_M_string_length;
    } while (psVar19 != local_168);
    pMVar9 = (this->mc).module;
    if ((pMVar9->data_segments).
        super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pMVar9->data_segments).
        super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pMVar9 = (this->mc).module;
    }
  }
  local_38 = (pMVar9->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  local_40 = (pMVar9->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if (local_38 != local_40) {
    local_48 = &this->cur_func;
    local_120 = &this->lst;
    local_50 = &(this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header;
    IVar16 = 0;
    pDVar27 = this;
    local_168 = __return_storage_ptr__;
    do {
      f = *local_38;
      this->cur_func = f;
      args_2 = (char (*) [2])(f->name)._M_string_length;
      name_02._M_str = (f->name)._M_dataplus._M_p;
      name_02._M_len = (size_t)args_2;
      local_170 = IVar16;
      bVar8 = CheckImportExport(this,__return_storage_ptr__,First,IVar16,name_02);
      AST::AST((AST *)local_118,&this->mc,f);
      this->cur_ast = (AST *)local_118;
      local_169 = bVar8;
      if (!bVar8) {
        args_2 = (char (*) [2])0x1;
        AST::Construct((AST *)local_118,&f->exprs,
                       (Index)((ulong)((long)(f->decl).sig.result_types.
                                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(f->decl).sig.result_types.
                                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3),0,true)
        ;
        this_00 = local_120;
        LoadStoreTracking::Track(local_120,(Node *)local_118._8_8_);
        LoadStoreTracking::CheckLayouts(this_00);
      }
      cat<char[10],std::__cxx11::string,char[2]>
                (&local_190,(wabt *)"function ",(char (*) [10])f,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1edb8e,
                 args_2);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_190._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      pTVar11 = (f->decl).sig.param_types.
                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (((long)(f->decl).sig.param_types.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pTVar11 & 0x7fffffff8U) != 0) {
        uVar21 = 0;
        do {
          cVar17 = (char)&local_160;
          if (uVar21 == 0) {
            t = *pTVar11;
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            local_160._M_string_length = 0;
            local_160.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::push_back(cVar17);
          }
          else {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            t = (f->decl).sig.param_types.
                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                super__Vector_impl_data._M_start[uVar21];
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            local_160._M_string_length = 0;
            local_160.field_2._M_local_buf[0] = '\0';
            uVar13 = uVar21 & 0xffffffff;
            this = pDVar27;
            do {
              uVar12 = (uint)uVar13;
              std::__cxx11::string::push_back(cVar17);
              uVar13 = (ulong)((int)(uVar13 / 0x1a) - 1);
              pDVar27 = this;
            } while (0x19 < uVar12);
          }
          args_2 = (char (*) [2])0x1;
          plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_160,0,(char *)0x0,0x1d7d84);
          __return_storage_ptr__ = local_168;
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          puVar1 = (ulong *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar1) {
            local_190.field_2._M_allocated_capacity = *puVar1;
            local_190.field_2._8_8_ = plVar10[3];
          }
          else {
            local_190.field_2._M_allocated_capacity = *puVar1;
            local_190._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_190._M_string_length = plVar10[1];
          *plVar10 = (long)puVar1;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,
                            CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                     local_160.field_2._M_local_buf[0]) + 1);
          }
          LocalDecl(&local_160,this,&local_190,t);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_160._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,
                            CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                     local_160.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          uVar21 = uVar21 + 1;
          pTVar11 = (f->decl).sig.param_types.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar21 < ((ulong)((long)(f->decl).sig.param_types.
                                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar11)
                           >> 3 & 0xffffffff));
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pTVar11 = (f->decl).sig.result_types.
                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                super__Vector_impl_data._M_start;
      pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((ulong)((long)(f->decl).sig.result_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pTVar11) >> 3);
      if ((int)pbVar14 != 0) {
        if ((int)pbVar14 == 1) {
          EVar2 = pTVar11->enum_;
          pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (ulong)(uint)(EVar2 + 0x11);
          if ((uint)(EVar2 + 0x11) < 0x19) {
            pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&switchD_00157cc5::switchdataD_001e1b88 +
                      (long)(int)(&switchD_00157cc5::switchdataD_001e1b88)[(long)pbVar15]);
            local_160._M_dataplus._M_p = "byte";
            switch(pbVar15) {
            case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
              local_160._M_dataplus._M_p = "externref";
              break;
            case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
              local_160._M_dataplus._M_p = "funcref";
              break;
            default:
switchD_00157cc5_caseD_fffffff1:
              local_160._M_dataplus._M_p = "ILLEGAL";
              break;
            case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa:
              local_160._M_dataplus._M_p = "short";
              break;
            case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xb:
              break;
            case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc:
              local_160._M_dataplus._M_p = "simd";
              break;
            case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xd:
              local_160._M_dataplus._M_p = "double";
              break;
            case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe:
              local_160._M_dataplus._M_p = "float";
              break;
            case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf:
              local_160._M_dataplus._M_p = "long";
              break;
            case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10:
              local_160._M_dataplus._M_p = "int";
              break;
            case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x15:
              local_160._M_dataplus._M_p = "ubyte";
              break;
            case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17:
              local_160._M_dataplus._M_p = "ushort";
              break;
            case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18:
              local_160._M_dataplus._M_p = "uint";
            }
          }
          else {
            pbVar14 = pbVar15;
            if (EVar2 == Void) {
              local_160._M_dataplus._M_p = "void";
            }
            else {
              if (EVar2 != Func) goto switchD_00157cc5_caseD_fffffff1;
              local_160._M_dataplus._M_p = "func";
            }
          }
          cat<char[2],char_const*>(&local_190,(wabt *)":",(char (*) [2])&local_160,(char **)pbVar14)
          ;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_190._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          pTVar11 = (f->decl).sig.result_types.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)(f->decl).sig.result_types.
                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pTVar11);
          if (((ulong)pbVar14 & 0x7fffffff8) != 0) {
            lVar20 = 0;
            pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            do {
              if (pbVar15 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                pTVar11 = (pointer)((long)&((f->decl).sig.result_types.
                                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->enum_ +
                                   lVar20);
              }
              EVar2 = pTVar11->enum_;
              switch(EVar2) {
              case I8U:
                break;
              case I16U:
                break;
              case I32U:
                break;
              case ExternRef:
                break;
              case FuncRef:
                break;
              case 0xfffffff1:
              case 0xfffffff2:
              case 0xfffffff3:
              case FuncRef|I8U:
              case 0xfffffff5:
              case FuncRef|I16U:
              case FuncRef|I32U:
              case ~I32U:
              case Any:
              case ~I64:
              case ~F32:
              case ~F64:
              case ~I8:
switchD_00157d49_caseD_fffffff1:
                break;
              case I16:
                break;
              case I8:
                break;
              case V128:
                break;
              case F64:
                break;
              case F32:
                break;
              case I64:
                break;
              case I32:
                break;
              default:
                if ((EVar2 != Void) && (EVar2 != Func)) goto switchD_00157d49_caseD_fffffff1;
              }
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&(pbVar15->_M_dataplus)._M_p + 1);
              pTVar11 = (f->decl).sig.result_types.
                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((ulong)((long)(f->decl).sig.result_types.
                                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pTVar11) >>
                         3 & 0xffffffff);
              lVar20 = lVar20 + 8;
            } while (pbVar15 < pbVar14);
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      IVar16 = local_170;
      cVar17 = '\x01';
      if (local_169 == '\0') {
        if (9 < local_170) {
          IVar26 = local_170;
          cVar18 = '\x04';
          do {
            cVar17 = cVar18;
            if (IVar26 < 100) {
              cVar17 = cVar17 + -2;
              goto LAB_0015804e;
            }
            if (IVar26 < 1000) {
              cVar17 = cVar17 + -1;
              goto LAB_0015804e;
            }
            if (IVar26 < 10000) goto LAB_0015804e;
            bVar8 = 99999 < IVar26;
            IVar26 = IVar26 / 10000;
            cVar18 = cVar17 + '\x04';
          } while (bVar8);
          cVar17 = cVar17 + '\x01';
        }
LAB_0015804e:
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_160,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_160._M_dataplus._M_p,(uint)local_160._M_string_length,IVar16);
        cat<char[11],std::__cxx11::string,char[2]>
                  (&local_190,(wabt *)" { // func",(char (*) [11])&local_160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e2032,
                   args_2);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_190._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,
                          CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                   local_160.field_2._M_local_buf[0]) + 1);
        }
        DecompileExpr((Value *)&local_190,this,(Node *)local_118._8_8_,(Node *)0x0);
        IndentValue(this,(Value *)&local_190,this->indent_amount,(string_view)ZEXT816(0));
        sVar6 = local_190._M_string_length;
        this = pDVar27;
        for (_Var25._M_p = local_190._M_dataplus._M_p; _Var25._M_p != (pointer)sVar6;
            _Var25._M_p = _Var25._M_p + 0x20) {
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)_Var25._M_p);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_190);
        IVar16 = local_170;
        pDVar27 = this;
      }
      else {
        if (9 < local_170) {
          pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (ulong)local_170;
          cVar18 = '\x04';
          do {
            cVar17 = cVar18;
            uVar12 = (uint)pbVar14;
            if (uVar12 < 100) {
              cVar17 = cVar17 + -2;
              goto LAB_00157fb9;
            }
            if (uVar12 < 1000) {
              cVar17 = cVar17 + -1;
              goto LAB_00157fb9;
            }
            if (uVar12 < 10000) goto LAB_00157fb9;
            pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((ulong)pbVar14 / 10000);
            cVar18 = cVar17 + '\x04';
          } while (99999 < uVar12);
          cVar17 = cVar17 + '\x01';
        }
LAB_00157fb9:
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_160,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_160._M_dataplus._M_p,(uint)local_160._M_string_length,IVar16);
        cat<char[10],std::__cxx11::string>
                  (&local_190,(wabt *)"; // func",(char (*) [10])&local_160,pbVar14);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_190._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,
                          CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                   local_160.field_2._M_local_buf[0]) + 1);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      ModuleContext::EndFunc(&this->mc);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
                  *)local_120,
                 (_Link_type)(this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                );
      (this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_50;
      (this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_50;
      (this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      IVar16 = IVar16 + 1;
      *local_48 = (Func *)0x0;
      local_48[1] = (Func *)0x0;
      AST::~AST((AST *)local_118);
      local_38 = local_38 + 1;
    } while (local_38 != local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Decompile() {
    std::string s;
    // Memories.
    Index memory_index = 0;
    for (auto m : mc.module.memories) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Memory, memory_index, m->name);
      s += cat("memory ", m->name);
      if (!is_import) {
        s += cat("(initial: ", std::to_string(m->page_limits.initial),
                 ", max: ", std::to_string(m->page_limits.max), ")");
      }
      s += ";\n";
      memory_index++;
    }
    if (!mc.module.memories.empty())
      s += "\n";

    // Globals.
    Index global_index = 0;
    for (auto g : mc.module.globals) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Global, global_index, g->name);
      s += cat("global ", g->name, ":", GetDecompTypeName(g->type));
      if (!is_import) {
        s += cat(" = ", InitExp(g->init_expr));
      }
      s += ";\n";
      global_index++;
    }
    if (!mc.module.globals.empty())
      s += "\n";

    // Tables.
    Index table_index = 0;
    for (auto tab : mc.module.tables) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Table, table_index, tab->name);
      s += cat("table ", tab->name, ":", GetDecompTypeName(tab->elem_type));
      if (!is_import) {
        s += cat("(min: ", std::to_string(tab->elem_limits.initial),
                 ", max: ", std::to_string(tab->elem_limits.max), ")");
      }
      s += ";\n";
      table_index++;
    }
    if (!mc.module.tables.empty())
      s += "\n";

    // Data.
    for (auto dat : mc.module.data_segments) {
      s += cat("data ", dat->name,
               dat->kind != SegmentKind::Passive
                   ? cat("(offset: ", InitExp(dat->offset))
                   : "(passive",
               ") =");
      auto ds = BinaryToString(dat->data);
      if (ds.size() > target_exp_width / 2) {
        s += "\n";
      } else {
        s += " ";
      }
      s += ds;
      s += ";\n";
    }
    if (!mc.module.data_segments.empty())
      s += "\n";

    // Code.
    Index func_index = 0;
    for (auto f : mc.module.funcs) {
      cur_func = f;
      auto is_import =
          CheckImportExport(s, ExternalKind::Func, func_index, f->name);
      AST ast(mc, f);
      cur_ast = &ast;
      if (!is_import) {
        ast.Construct(f->exprs, f->GetNumResults(), 0, true);
        lst.Track(ast.exp_stack[0]);
        lst.CheckLayouts();
      }
      s += cat("function ", f->name, "(");
      for (Index i = 0; i < f->GetNumParams(); i++) {
        if (i)
          s += ", ";
        auto t = f->GetParamType(i);
        auto name = "$" + IndexToAlphaName(i);
        s += LocalDecl(name, t);
      }
      s += ")";
      if (f->GetNumResults()) {
        if (f->GetNumResults() == 1) {
          s += cat(":", GetDecompTypeName(f->GetResultType(0)));
        } else {
          s += ":(";
          for (Index i = 0; i < f->GetNumResults(); i++) {
            if (i)
              s += ", ";
            s += GetDecompTypeName(f->GetResultType(i));
          }
          s += ")";
        }
      }
      if (is_import) {
        s += cat("; // func", std::to_string(func_index));
      } else {
        s += cat(" { // func", std::to_string(func_index), "\n");
        auto val = DecompileExpr(ast.exp_stack[0], nullptr);
        IndentValue(val, indent_amount, {});
        for (auto& stat : val.v) {
          s += stat;
          s += "\n";
        }
        s += "}";
      }
      s += "\n\n";
      mc.EndFunc();
      lst.Clear();
      func_index++;
      cur_ast = nullptr;
      cur_func = nullptr;
    }
    return s;
  }